

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O3

char * Io_NtkDeriveSop(Mem_Flex_t *pMem,word uTruth,int nVars,Vec_Int_t *vCover)

{
  int iVar1;
  uint uVar2;
  char *pSop;
  word local_28;
  
  local_28 = uTruth;
  uVar2 = Kit_TruthIsop((uint *)&local_28,nVars,vCover,1);
  if (1 < uVar2) {
    __assert_fail("RetValue == 0 || RetValue == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioWriteBlif.c"
                  ,800,"char *Io_NtkDeriveSop(Mem_Flex_t *, word, int, Vec_Int_t *)");
  }
  iVar1 = vCover->nSize;
  if ((iVar1 == 0) || ((iVar1 == 1 && (*vCover->pArray == 0)))) {
    if (uVar2 != 0) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioWriteBlif.c"
                    ,0x325,"char *Io_NtkDeriveSop(Mem_Flex_t *, word, int, Vec_Int_t *)");
    }
    pSop = " 1\n";
    if (iVar1 == 0) {
      pSop = " 0\n";
    }
  }
  else {
    pSop = Abc_SopCreateFromIsop(pMem,nVars,vCover);
    if (uVar2 != 0) {
      Abc_SopComplement(pSop);
    }
  }
  return pSop;
}

Assistant:

char * Io_NtkDeriveSop( Mem_Flex_t * pMem, word uTruth, int nVars, Vec_Int_t * vCover )
{
    char * pSop;
    int RetValue = Kit_TruthIsop( (unsigned *)&uTruth, nVars, vCover, 1 );
    assert( RetValue == 0 || RetValue == 1 );
    // check the case of constant cover
    if ( Vec_IntSize(vCover) == 0 || (Vec_IntSize(vCover) == 1 && Vec_IntEntry(vCover,0) == 0) )
    {
        char * pStr0 = " 0\n", * pStr1 = " 1\n";
        assert( RetValue == 0 );
        return Vec_IntSize(vCover) == 0 ? pStr0 : pStr1;
    }
    // derive the AIG for that tree
    pSop = Abc_SopCreateFromIsop( pMem, nVars, vCover );
    if ( RetValue )
        Abc_SopComplement( pSop );
    return pSop;
}